

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void implementations::scheme::scheme_test(void)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  environment *this_00;
  ostream *poVar3;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  cell *extraout_RDX;
  cell *extraout_RDX_00;
  cell *extraout_RDX_01;
  cell *exp;
  env_p env;
  cell result;
  string line;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  env_p local_218;
  env_p local_208;
  env_p local_1f8;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  long *local_190 [2];
  long local_180 [2];
  cell local_170;
  env_p local_118;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  cell local_e0;
  cell local_88;
  
  local_f8 = 0;
  local_f0 = 0;
  local_100 = &local_f0;
  this_00 = (environment *)operator_new(0x98);
  local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  environment::environment(this_00,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<implementations::scheme::environment*>(&local_220,this_00);
  if (local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this._M_pi = local_220._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  add_globals(this_00);
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  pcVar1 = local_1e8 + 0x10;
  local_1e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"(define multiply-by (lambda (n) (lambda (y) (* y n))))","");
  read((int)&local_170,local_1e8,__nbytes);
  local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_220._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  eval(&local_88,&local_170,&local_1f8);
  if (local_88.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_88.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.val._M_dataplus._M_p != &local_88.val.field_2) {
    operator_delete(local_88.val._M_dataplus._M_p,local_88.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_170.list);
  paVar2 = &local_170.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.val._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.val._M_dataplus._M_p,local_170.val.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1e8._0_8_ != pcVar1) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_1e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"(define doubler (multiply-by 2))","");
  read((int)&local_170,local_1e8,__nbytes_00);
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_220._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  eval(&local_e0,&local_170,&local_208);
  if (local_e0.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_e0.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.val._M_dataplus._M_p != &local_e0.val.field_2) {
    operator_delete(local_e0.val._M_dataplus._M_p,local_e0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_170.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.val._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.val._M_dataplus._M_p,local_170.val.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1e8._0_8_ != pcVar1) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"(doubler 4)","");
  read((int)local_1e8,local_190,__nbytes_01);
  local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_220._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  eval(&local_170,(cell *)local_1e8,&local_218);
  if (local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_1c0);
  exp = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._8_8_ != &local_1d0) {
    operator_delete((void *)local_1e8._8_8_,local_1d0._M_allocated_capacity + 1);
    exp = extraout_RDX_00;
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
    exp = extraout_RDX_01;
  }
  to_string_abi_cxx11_((string *)local_1e8,(scheme *)&local_170,exp);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1e8._0_8_,local_1e8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((char *)local_1e8._0_8_ != pcVar1) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if (local_170.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_170.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.val._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.val._M_dataplus._M_p,local_170.val.field_2._M_allocated_capacity + 1);
  }
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return;
}

Assistant:

void execute() {
		if (isResolved())
			return;
		if (subframe != nullptr) {
			subframe->execute();
			if (subframe->isResolved()) {
				// Copy results
				cell res(subframe->result);
				auto mode = subframe_mode;
				DEBUG("  subframe(" + std::string((mode == Argument ? "arg" : "proc")) + ") = " + to_string(res));
				// Clear subframe
				delete subframe;
				subframe = nullptr;
				subframe_mode = None;
				// Do something with result
				switch (mode) {
				case Argument:
					resolved_arguments.push_back(res);
					++arg_it;
					nextArgument();
					break;
				case Procedure:
					result = res;
					nextExpression();
					break;
				default:
					throw std::runtime_error("Invalid subframe mode None");
				}
			}
		}  else if (arg_it == arguments.cend())
			dispatch();
		else
			nextArgument();
	}